

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eoclient.cpp
# Opt level: O1

void __thiscall EOClient::Execute(EOClient *this,string *data)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  _List_node_base *p_Var3;
  EOServer *pEVar4;
  bool bVar5;
  PacketFamily PVar6;
  PacketAction PVar7;
  bool bVar8;
  unsigned_short uVar9;
  IPAddress IVar10;
  mapped_type *pmVar11;
  byte bVar12;
  uint uVar13;
  uint uVar14;
  PacketReader reader;
  string local_98;
  IPAddress local_74;
  string local_70;
  PacketReader local_50;
  
  if (data->_M_string_length < 2) {
    return;
  }
  bVar5 = Client::Connected(&this->super_Client);
  if (!bVar5) {
    return;
  }
  PacketProcessor::Decode(&local_70,&this->processor,data);
  PacketReader::PacketReader(&local_50,&local_70);
  paVar1 = &local_70.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((this->super_Client).accepted == false) {
    PVar6 = PacketReader::Family(&local_50);
    bVar5 = false;
    if ((PVar6 == PACKET_CONNECTION) || (PVar6 == PACKET_F_INIT)) {
      bVar12 = 0;
    }
    else {
      bVar8 = false;
      if (PVar6 == PACKET_PLAYERS) {
        PVar7 = PacketReader::Action(&local_50);
        if (PVar7 == PACKET_LIST) {
          p_Var3 = (this->super_Client).server[1].clients.
                   super__List_base<Client_*,_std::allocator<Client_*>_>._M_impl._M_node.
                   super__List_node_base._M_prev;
          local_70._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"AllowStats","");
          pmVar11 = std::__detail::
                    _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)&p_Var3[0x19]._M_prev,&local_70);
          bVar8 = util::variant::GetBool(pmVar11);
          bVar5 = true;
        }
        else {
          bVar5 = false;
          bVar8 = false;
        }
      }
      bVar12 = bVar8 ^ 1;
    }
    if ((bVar5) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar1)) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if (bVar12 != 0) {
      pEVar4 = (EOServer *)(this->super_Client).server;
      IVar10 = Client::GetRemoteAddr(&this->super_Client);
      local_98._M_dataplus._M_p._0_4_ = IVar10.address;
      EOServer::RecordClientRejection(pEVar4,(IPAddress *)&local_98,"bad packet");
      Client::Close(&this->super_Client,true);
      if (bVar12 != 0) goto LAB_00133a14;
    }
  }
  PVar6 = PacketReader::Family(&local_50);
  if (PVar6 == PACKET_INTERNAL) {
    local_74 = Client::GetRemoteAddr(&this->super_Client);
    IPAddress::operator_cast_to_string(&local_98,&local_74);
    Console::Wrn("Closing client connection sending a reserved packet ID: %s");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    Client::Close(&this->super_Client,false);
  }
  else {
    PVar6 = PacketReader::Family(&local_50);
    if (PVar6 == PACKET_F_INIT) {
      this->seq = this->seq + ((this->seq + 1) / 10) * -10 + 1;
    }
    else {
      PVar6 = PacketReader::Family(&local_50);
      if ((PVar6 == PACKET_CONNECTION) &&
         (PVar7 = PacketReader::Action(&local_50), PVar7 == PACKET_PING)) {
        this->seq_start = this->upcoming_seq_start;
      }
      iVar2 = this->seq;
      uVar13 = this->seq_start + iVar2;
      this->seq = iVar2 + ((iVar2 + 1) / 10) * -10 + 1;
      if ((int)uVar13 < 0xfd) {
        bVar12 = PacketReader::GetChar(&local_50);
        uVar14 = (uint)bVar12;
      }
      else {
        uVar9 = PacketReader::GetShort(&local_50);
        uVar14 = (uint)uVar9;
      }
      p_Var3 = (this->super_Client).server[1].clients.
               super__List_base<Client_*,_std::allocator<Client_*>_>._M_impl._M_node.
               super__List_node_base._M_prev;
      paVar1 = &local_98.field_2;
      local_98._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"EnforceSequence","");
      pmVar11 = std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)&p_Var3[0x19]._M_prev,&local_98);
      bVar5 = util::variant::GetBool(pmVar11);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != paVar1) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      if (bVar5 && uVar14 != uVar13) {
        bVar5 = (this->super_Client).accepted;
        if (bVar5 == true) {
          local_74 = Client::GetRemoteAddr(&this->super_Client);
          IPAddress::operator_cast_to_string(&local_98,&local_74);
          Console::Wrn("Closing client connection sending invalid sequence: %s, Got %i, expected %i."
                       ,local_98._M_dataplus._M_p,(ulong)uVar14,(ulong)uVar13);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != paVar1) {
            operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          pEVar4 = (EOServer *)(this->super_Client).server;
          IVar10 = Client::GetRemoteAddr(&this->super_Client);
          local_98._M_dataplus._M_p._0_4_ = IVar10.address;
          EOServer::RecordClientRejection(pEVar4,(IPAddress *)&local_98,"bad sequence");
        }
        Client::Close(&this->super_Client,(bool)(bVar5 ^ 1));
        goto LAB_00133a14;
      }
    }
    ActionQueue::AddAction(&this->queue,&local_50,0.02,true);
  }
LAB_00133a14:
  PacketReader::~PacketReader(&local_50);
  return;
}

Assistant:

void EOClient::Execute(const std::string &data)
{
	if (data.length() < 2)
		return;

	if (!this->Connected())
		return;

	PacketReader reader(processor.Decode(data));

	if (!this->accepted)
	{
		PacketFamily family = reader.Family();

		if (family != PACKET_F_INIT && family != PACKET_CONNECTION
		 && !(family == PACKET_PLAYERS && reader.Action() == PACKET_LIST && this->server()->world->config["AllowStats"]))
		{
			this->server()->RecordClientRejection(this->GetRemoteAddr(), "bad packet");
			this->Close(true);
			return;
		}
	}

	if (reader.Family() == PACKET_INTERNAL)
	{
		Console::Wrn("Closing client connection sending a reserved packet ID: %s", static_cast<std::string>(this->GetRemoteAddr()).c_str());
		this->Close();
		return;
	}

	if (reader.Family() != PACKET_F_INIT)
	{
		bool ping_reply = (reader.Family() == PACKET_CONNECTION && reader.Action() == PACKET_PING);

		if (ping_reply)
			this->PongNewSequence();

		int client_seq;
		int server_seq = this->GenSequence();

		if (server_seq >= 253)
			client_seq = reader.GetShort();
		else
			client_seq = reader.GetChar();

		if (this->server()->world->config["EnforceSequence"])
		{
			if (client_seq != server_seq)
			{
				if (this->accepted)
				{
					Console::Wrn("Closing client connection sending invalid sequence: %s, Got %i, expected %i.", static_cast<std::string>(this->GetRemoteAddr()).c_str(), client_seq, server_seq);
					this->Close();
					return;
				}
				else
				{
					this->server()->RecordClientRejection(this->GetRemoteAddr(), "bad sequence");
					this->Close(true);
					return;
				}
			}
		}
	}
	else
	{
		this->GenSequence();
	}

	queue.AddAction(reader, 0.02, true);
}